

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::SSARewriter::FinalizePhiCandidate(SSARewriter *this,PhiCandidate *phi_candidate)

{
  pointer *pppPVar1;
  IRContext *pIVar2;
  CFG *this_00;
  Instruction *this_01;
  uint32_t *puVar3;
  pointer puVar4;
  iterator __position;
  uint32_t uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *bb;
  const_iterator cVar7;
  uint uVar8;
  uint32_t *puVar9;
  PhiCandidate *local_40;
  BasicBlock *local_38;
  
  local_40 = phi_candidate;
  if ((phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("phi_candidate->phi_args().size() > 0 && \"Phi candidate should have arguments\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0x25f,"void spvtools::opt::SSARewriter::FinalizePhiCandidate(PhiCandidate *)");
  }
  pIVar2 = (this->pass_->super_Pass).context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  this_01 = (phi_candidate->bb_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar5 = 0;
  if (this_01->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  pvVar6 = CFG::preds(this_00,uVar5);
  puVar9 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar9 != puVar3) {
    uVar8 = 0;
    do {
      uVar5 = *puVar9;
      pIVar2 = (this->pass_->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar2);
      }
      bb = CFG::block((pIVar2->cfg_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                      .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar5);
      puVar4 = (phi_candidate->phi_args_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar4[uVar8] == 0) {
        local_38 = bb;
        cVar7 = std::
                _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->sealed_blocks_)._M_h,&local_38);
        if (cVar7.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur ==
            (__node_type *)0x0) {
          uVar5 = MemPass::GetUndefVal(this->pass_,phi_candidate->var_id_);
        }
        else {
          uVar5 = GetReachingDef(this,phi_candidate->var_id_,bb);
        }
        puVar4[uVar8] = uVar5;
      }
      puVar9 = puVar9 + 1;
      uVar8 = uVar8 + 1;
    } while (puVar9 != puVar3);
  }
  phi_candidate->is_complete_ = true;
  uVar5 = TryRemoveTrivialPhi(this,phi_candidate);
  if (uVar5 == phi_candidate->result_id_) {
    if (phi_candidate->copy_of_ != 0) {
      __assert_fail("!phi_candidate->copy_of() && \"A completed Phi cannot be trivial.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                    ,0x276,"void spvtools::opt::SSARewriter::FinalizePhiCandidate(PhiCandidate *)");
    }
    __position._M_current =
         (this->phis_to_generate_).
         super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->phis_to_generate_).
        super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
      ::_M_realloc_insert<spvtools::opt::SSARewriter::PhiCandidate*const&>
                ((vector<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
                  *)&this->phis_to_generate_,__position,&local_40);
    }
    else {
      *__position._M_current = phi_candidate;
      pppPVar1 = &(this->phis_to_generate_).
                  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  return;
}

Assistant:

void SSARewriter::FinalizePhiCandidate(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() > 0 &&
         "Phi candidate should have arguments");

  uint32_t ix = 0;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);
    uint32_t& arg_id = phi_candidate->phi_args()[ix++];
    if (arg_id == 0) {
      // If |pred_bb| is still not sealed, it means it's unreachable. In this
      // case, we just use Undef as an argument.
      arg_id = IsBlockSealed(pred_bb)
                   ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                   : pass_->GetUndefVal(phi_candidate->var_id());
    }
  }

  // This candidate is now completed.
  phi_candidate->MarkComplete();

  // If |phi_candidate| is not trivial, add it to the list of Phis to
  // generate.
  if (TryRemoveTrivialPhi(phi_candidate) == phi_candidate->result_id()) {
    // If we could not remove |phi_candidate|, it means that it is complete
    // and not trivial. Add it to the list of Phis to generate.
    assert(!phi_candidate->copy_of() && "A completed Phi cannot be trivial.");
    phis_to_generate_.push_back(phi_candidate);
  }
}